

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O1

RelationStats *
duckdb::RelationStatisticsHelper::ExtractWindowStats
          (RelationStats *__return_storage_ptr__,LogicalWindow *window,RelationStats *child_stats)

{
  pointer *ppDVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->cardinality = child_stats->cardinality;
  ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::operator=
            ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
             __return_storage_ptr__,
             (vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)child_stats);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__return_storage_ptr__->column_names,
              &(child_stats->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  __return_storage_ptr__->stats_initialized = true;
  (*(window->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_50,window);
  uVar3 = CONCAT44(local_50._M_string_length._4_4_,(uint)local_50._M_string_length) -
          (long)local_50._M_dataplus._M_p >> 4;
  if (local_50._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar2 = (long)(child_stats->column_distinct_count).
                super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(child_stats->column_distinct_count).
                super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  lVar4 = uVar3 - uVar2;
  if (uVar2 <= uVar3 && lVar4 != 0) {
    do {
      local_50._M_dataplus._M_p = (pointer)child_stats->cardinality;
      local_50._M_string_length._0_4_ = (uint)local_50._M_string_length & 0xffffff00;
      __position._M_current =
           (__return_storage_ptr__->column_distinct_count).
           super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
           super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->column_distinct_count).
          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
        _M_realloc_insert<duckdb::DistinctCount>
                  ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                   __return_storage_ptr__,__position,(DistinctCount *)&local_50);
      }
      else {
        local_50._M_dataplus._M_p._4_4_ = (undefined4)((ulong)local_50._M_dataplus._M_p >> 0x20);
        *(undefined4 *)&(__position._M_current)->distinct_count = local_50._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(__position._M_current)->distinct_count + 4) =
             local_50._M_dataplus._M_p._4_4_;
        *(uint *)&(__position._M_current)->from_hll = (uint)local_50._M_string_length;
        *(undefined4 *)&(__position._M_current)->field_0xc = local_50._M_string_length._4_4_;
        ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"window","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->column_names,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractWindowStats(LogicalWindow &window, RelationStats &child_stats) {
	RelationStats stats;
	stats.cardinality = child_stats.cardinality;
	stats.column_distinct_count = child_stats.column_distinct_count;
	stats.column_names = child_stats.column_names;
	stats.stats_initialized = true;
	auto num_child_columns = window.GetColumnBindings().size();

	for (idx_t column_index = child_stats.column_distinct_count.size(); column_index < num_child_columns;
	     column_index++) {
		stats.column_distinct_count.push_back(DistinctCount({child_stats.cardinality, false}));
		stats.column_names.push_back("window");
	}
	return stats;
}